

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O3

DeepTiledOutputFile * __thiscall
Imf_2_5::MultiPartOutputFile::getOutputPart<Imf_2_5::DeepTiledOutputFile>
          (MultiPartOutputFile *this,int partNumber)

{
  _Rb_tree_header *p_Var1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  int iVar3;
  _Base_ptr p_Var4;
  DeepTiledOutputFile *this_00;
  mapped_type *ppGVar5;
  _Base_ptr p_Var6;
  int local_3c;
  pair<int,_Imf_2_5::GenericOutputFile_*> local_38;
  
  __mutex = (pthread_mutex_t *)this->_data;
  local_3c = partNumber;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pDVar2 = this->_data;
  p_Var4 = (pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (partNumber <= (int)p_Var4[1]._M_color) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < partNumber];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && ((int)p_Var6[1]._M_color <= partNumber)) {
      ppGVar5 = std::
                map<int,_Imf_2_5::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericOutputFile_*>_>_>
                ::operator[](&pDVar2->_outputFiles,&local_3c);
      this_00 = (DeepTiledOutputFile *)*ppGVar5;
      goto LAB_001f2ae8;
    }
  }
  this_00 = (DeepTiledOutputFile *)operator_new(0x10);
  DeepTiledOutputFile::DeepTiledOutputFile
            (this_00,(pDVar2->parts).
                     super__Vector_base<Imf_2_5::OutputPartData_*,_std::allocator<Imf_2_5::OutputPartData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[partNumber]);
  local_38.first = partNumber;
  local_38.second = (GenericOutputFile *)this_00;
  std::
  _Rb_tree<int,std::pair<int_const,Imf_2_5::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericOutputFile*>>>
  ::_M_emplace_unique<std::pair<int,Imf_2_5::GenericOutputFile*>>
            ((_Rb_tree<int,std::pair<int_const,Imf_2_5::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericOutputFile*>>>
              *)&this->_data->_outputFiles,&local_38);
LAB_001f2ae8:
  pthread_mutex_unlock(__mutex);
  return this_00;
}

Assistant:

T*
MultiPartOutputFile::getOutputPart(int partNumber)
{
    Lock lock(*_data);
    if (_data->_outputFiles.find(partNumber) == _data->_outputFiles.end())
    {
        T* file = new T(_data->parts[partNumber]);
        _data->_outputFiles.insert(std::make_pair(partNumber, (GenericOutputFile*) file));
        return file;
    }
    else return (T*) _data->_outputFiles[partNumber];
}